

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

bool __thiscall C3DFile::load(C3DFile *this,char *filename)

{
  byte bVar1;
  ostream *poVar2;
  long local_228;
  ifstream c3dstream;
  char *filename_local;
  C3DFile *this_local;
  
  std::ifstream::ifstream(&local_228,filename,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::read((char *)&local_228,(long)this);
    if ((this->header).c3d_id == 'P') {
      readParameterSection(this,(ifstream *)&local_228);
      fillPointLabelMap(this);
      readPointSection(this,(ifstream *)&local_228);
      std::ifstream::close();
      this_local._7_1_ = true;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Invalid C3D file!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Could not open file ");
    poVar2 = std::operator<<(poVar2,filename);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_228);
  return this_local._7_1_;
}

Assistant:

bool C3DFile::load (const char* filename) {
	ifstream c3dstream (filename, ios::binary);
	if (!c3dstream) {
		cerr << "Could not open file " << filename << endl;
		return false;
	}

	// header section
	c3dstream.read(reinterpret_cast<char *>(&header), sizeof(C3DHeader));
	if (header.c3d_id != 0x50) {
		cerr << "Invalid C3D file!" << endl;
		return false;
	}

	// parameter Section
	readParameterSection (c3dstream);  

	// we read out all the indices of the labels for easier future reference
	fillPointLabelMap();

	// 3d point data section (we currently ignore the analog part)
	readPointSection(c3dstream);

	c3dstream.close();

	return true;
}